

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O2

void __thiscall duckdb::LogicalCTERef::Serialize(LogicalCTERef *this,Serializer *serializer)

{
  LogicalOperator::Serialize(&this->super_LogicalOperator,serializer);
  Serializer::WritePropertyWithDefault<unsigned_long>
            (serializer,200,"table_index",&this->table_index);
  Serializer::WritePropertyWithDefault<unsigned_long>(serializer,0xc9,"cte_index",&this->cte_index);
  Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::LogicalType,true>>
            (serializer,0xca,"chunk_types",&this->chunk_types);
  Serializer::WritePropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (serializer,0xcb,"bound_columns",&this->bound_columns);
  Serializer::WriteProperty<duckdb::CTEMaterialize>
            (serializer,0xcc,"materialized_cte",&this->materialized_cte);
  Serializer::WritePropertyWithDefault<bool>(serializer,0xcd,"is_recurring",&this->is_recurring);
  return;
}

Assistant:

void LogicalCTERef::Serialize(Serializer &serializer) const {
	LogicalOperator::Serialize(serializer);
	serializer.WritePropertyWithDefault<idx_t>(200, "table_index", table_index);
	serializer.WritePropertyWithDefault<idx_t>(201, "cte_index", cte_index);
	serializer.WritePropertyWithDefault<vector<LogicalType>>(202, "chunk_types", chunk_types);
	serializer.WritePropertyWithDefault<vector<string>>(203, "bound_columns", bound_columns);
	serializer.WriteProperty<CTEMaterialize>(204, "materialized_cte", materialized_cte);
	serializer.WritePropertyWithDefault<bool>(205, "is_recurring", is_recurring);
}